

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O0

void Am_Move_Cursor_To(Am_Object *text,int n)

{
  Am_Value *in_value;
  char *pcVar1;
  Am_Object local_40;
  int local_38;
  int head_pos;
  int local_24;
  int str_len;
  Am_String p;
  int n_local;
  Am_Object *text_local;
  
  p.data._4_4_ = n;
  in_value = Am_Object::Get(text,0xab,0);
  Am_String::Am_String((Am_String *)&stack0xffffffffffffffe0,in_value);
  pcVar1 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffe0);
  local_24 = ml_strlen(pcVar1);
  pcVar1 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffe0);
  local_38 = ml_head_pos_str(pcVar1);
  if ((local_38 <= p.data._4_4_) && (p.data._4_4_ <= local_24)) {
    Am_Object::Set(text,0xad,p.data._4_4_,0);
  }
  Am_Object::Am_Object(&local_40,text);
  Am_Set_Pending_Delete(&local_40,false);
  Am_Object::~Am_Object(&local_40);
  Am_String::~Am_String((Am_String *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void
Am_Move_Cursor_To(Am_Object text, int n)
{
  Am_String p = text.Get(Am_TEXT);
  int str_len = ml_strlen((const char *)p);
  int head_pos = ml_head_pos_str((const char *)p);

  if (n >= head_pos && n <= str_len)
    text.Set(Am_CURSOR_INDEX, n);
  Am_Set_Pending_Delete(text, false);
}